

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

_Bool matching_test_exists(char *test_name,CgreenVector *tests)

{
  _Bool _Var1;
  int iVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char *unaff_retaddr;
  int i;
  int iVar3;
  int iVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  iVar3 = 0;
  while( true ) {
    iVar4 = iVar3;
    iVar2 = cgreen_vector_size(in_RSI);
    if (iVar2 <= iVar3) {
      return false;
    }
    get_item_from((CgreenVector *)CONCAT44(iVar4,iVar3),(int)((ulong)in_RDI >> 0x20));
    _Var1 = test_matches_pattern
                      (unaff_retaddr,
                       (TestItem *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (_Var1) break;
    iVar3 = iVar4 + 1;
  }
  return true;
}

Assistant:

static bool matching_test_exists(const char *test_name, CgreenVector *tests) {
    for (int i = 0; i<cgreen_vector_size(tests); i++)
        if (test_matches_pattern(test_name, get_item_from(tests, i))) {
            return true;
        }
    return false;
}